

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regparse.c
# Opt level: O0

int onig_callout_tag_table_free(void *table)

{
  int iVar1;
  int r;
  CalloutTagTable *t;
  void *table_local;
  
  if (table != (void *)0x0) {
    iVar1 = callout_tag_table_clear((CalloutTagTable *)table);
    if (iVar1 != 0) {
      return iVar1;
    }
    onig_st_free_table((st_table *)table);
  }
  return 0;
}

Assistant:

extern int
onig_callout_tag_table_free(void* table)
{
  CalloutTagTable* t = (CalloutTagTable* )table;

  if (IS_NOT_NULL(t)) {
    int r = callout_tag_table_clear(t);
    if (r != 0) return r;

    onig_st_free_table(t);
  }

  return 0;
}